

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O3

TestCaseGroup * vkt::tessellation::createUserDefinedIOTests(TestContext *testCtx)

{
  undefined8 uVar1;
  TestNode *this;
  TestNode *this_00;
  TestNode *this_01;
  long *plVar2;
  UserDefinedIOTest *this_02;
  undefined8 *puVar3;
  long *plVar4;
  string *psVar5;
  CaseDefinition caseDef;
  string primitiveName;
  TessPrimitiveType local_154;
  string *local_138;
  long local_130;
  string local_128;
  TestContext *local_108;
  TessPrimitiveType local_100;
  IOType IStack_fc;
  VertexIOArraySize local_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string *local_b0 [2];
  string local_a0;
  undefined1 local_80;
  undefined7 uStack_7f;
  anon_struct_24_3_0e327d44 *local_70;
  undefined8 *local_68;
  undefined1 local_60 [16];
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this = (TestNode *)operator_new(0x70);
  local_108 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,testCtx,"user_defined_io",
             "Test non-built-in per-patch and per-vertex inputs and outputs");
  local_128.field_2._M_allocated_capacity = 0;
  do {
    this_00 = (TestNode *)operator_new(0x70);
    uVar1 = local_128.field_2._M_allocated_capacity;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)this_00,local_108,
               createUserDefinedIOTests::ioCases[local_128.field_2._M_allocated_capacity].name,
               createUserDefinedIOTests::ioCases[local_128.field_2._M_allocated_capacity].
               description);
    local_70 = createUserDefinedIOTests::ioCases + uVar1;
    local_128.field_2._8_8_ = 0;
    do {
      this_01 = (TestNode *)operator_new(0x70);
      uVar1 = local_128.field_2._8_8_;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)this_01,local_108,
                 createUserDefinedIOTests::vertexArraySizeCases[local_128.field_2._8_8_].name,"");
      local_154 = TESSPRIMITIVETYPE_TRIANGLES;
      puVar3 = &DAT_00d00ae0;
      do {
        local_68 = puVar3;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_b0,(char *)*puVar3,(allocator<char> *)&local_100);
        local_100 = local_154;
        IStack_fc = local_70->ioType;
        local_f8 = createUserDefinedIOTests::vertexArraySizeCases[uVar1].vertexIOArraySize;
        local_a0.field_2._8_8_ = 0;
        local_80 = 0;
        local_a0.field_2._M_allocated_capacity = (size_type)&local_80;
        plVar2 = (long *)std::__cxx11::string::append(local_a0.field_2._M_local_buf);
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_c0 = *plVar4;
          lStack_b8 = plVar2[3];
          local_d0 = &local_c0;
        }
        else {
          local_c0 = *plVar4;
          local_d0 = (long *)*plVar2;
        }
        local_c8 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0[0]);
        psVar5 = (string *)(plVar2 + 2);
        if ((string *)*plVar2 == psVar5) {
          local_128._M_dataplus._M_p = (psVar5->_M_dataplus)._M_p;
          local_128._M_string_length = plVar2[3];
          local_138 = &local_128;
        }
        else {
          local_128._M_dataplus._M_p = (psVar5->_M_dataplus)._M_p;
          local_138 = (string *)*plVar2;
        }
        local_130 = plVar2[1];
        *plVar2 = (long)psVar5;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_138);
        local_f0 = &local_e0;
        plVar4 = plVar2 + 2;
        if ((long *)*plVar2 == plVar4) {
          local_e0 = *plVar4;
          lStack_d8 = plVar2[3];
        }
        else {
          local_e0 = *plVar4;
          local_f0 = (long *)*plVar2;
        }
        local_e8 = plVar2[1];
        *plVar2 = (long)plVar4;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        if (local_138 != &local_128) {
          operator_delete(local_138,(ulong)(local_128._M_dataplus._M_p + 1));
        }
        if (local_d0 != &local_c0) {
          operator_delete(local_d0,local_c0 + 1);
        }
        if ((undefined1 *)local_a0.field_2._M_allocated_capacity != &local_80) {
          operator_delete((void *)local_a0.field_2._M_allocated_capacity,
                          CONCAT71(uStack_7f,local_80) + 1);
        }
        this_02 = (UserDefinedIOTest *)operator_new(0x168);
        local_138 = &local_128;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"");
        local_60._8_4_ = local_f8;
        local_60._4_4_ = IStack_fc;
        local_60._0_4_ = local_100;
        local_50._M_p = (pointer)&local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,local_f0,local_e8 + (long)local_f0);
        anon_unknown_1::UserDefinedIOTest::UserDefinedIOTest
                  (this_02,local_108,local_b0[0],local_138,(CaseDefinition *)local_60);
        tcu::TestNode::addChild(this_01,(TestNode *)this_02);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_p != &local_40) {
          operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
        }
        if (local_138 != &local_128) {
          operator_delete(local_138,(ulong)(local_128._M_dataplus._M_p + 1));
        }
        if (local_f0 != &local_e0) {
          operator_delete(local_f0,local_e0 + 1);
        }
        if (local_b0[0] != &local_a0) {
          operator_delete(local_b0[0],(ulong)(local_a0._M_dataplus._M_p + 1));
        }
        local_154 = local_154 + TESSPRIMITIVETYPE_QUADS;
        puVar3 = local_68 + 1;
      } while (local_154 != TESSPRIMITIVETYPE_LAST);
      tcu::TestNode::addChild(this_00,this_01);
      local_128.field_2._8_8_ = local_128.field_2._8_8_ + 1;
    } while (local_128.field_2._8_8_ != 3);
    tcu::TestNode::addChild(this,this_00);
    local_128.field_2._M_allocated_capacity = local_128.field_2._M_allocated_capacity + 1;
  } while (local_128.field_2._M_allocated_capacity != 6);
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createUserDefinedIOTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "user_defined_io", "Test non-built-in per-patch and per-vertex inputs and outputs"));

	static const struct
	{
		const char*	name;
		const char*	description;
		IOType		ioType;
	} ioCases[] =
	{
		{ "per_patch",					"Per-patch TCS outputs",					IO_TYPE_PER_PATCH				},
		{ "per_patch_array",			"Per-patch array TCS outputs",				IO_TYPE_PER_PATCH_ARRAY			},
		{ "per_patch_block",			"Per-patch TCS outputs in IO block",		IO_TYPE_PER_PATCH_BLOCK			},
		{ "per_patch_block_array",		"Per-patch TCS outputs in IO block array",	IO_TYPE_PER_PATCH_BLOCK_ARRAY	},
		{ "per_vertex",					"Per-vertex TCS outputs",					IO_TYPE_PER_VERTEX				},
		{ "per_vertex_block",			"Per-vertex TCS outputs in IO block",		IO_TYPE_PER_VERTEX_BLOCK		},
	};

	static const struct
	{
		const char*			name;
		VertexIOArraySize	vertexIOArraySize;
	} vertexArraySizeCases[] =
	{
		{ "vertex_io_array_size_implicit",			VERTEX_IO_ARRAY_SIZE_IMPLICIT					},
		{ "vertex_io_array_size_shader_builtin",	VERTEX_IO_ARRAY_SIZE_EXPLICIT_SHADER_BUILTIN	},
		{ "vertex_io_array_size_spec_min",			VERTEX_IO_ARRAY_SIZE_EXPLICIT_SPEC_MIN			},
	};

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(ioCases); ++caseNdx)
	{
		de::MovePtr<tcu::TestCaseGroup> ioTypeGroup (new tcu::TestCaseGroup(testCtx, ioCases[caseNdx].name, ioCases[caseNdx].description));
		for (int arrayCaseNdx = 0; arrayCaseNdx < DE_LENGTH_OF_ARRAY(vertexArraySizeCases); ++arrayCaseNdx)
		{
			de::MovePtr<tcu::TestCaseGroup> vertexArraySizeGroup (new tcu::TestCaseGroup(testCtx, vertexArraySizeCases[arrayCaseNdx].name, ""));
			for (int primitiveTypeNdx = 0; primitiveTypeNdx < TESSPRIMITIVETYPE_LAST; ++primitiveTypeNdx)
			{
				const TessPrimitiveType primitiveType = static_cast<TessPrimitiveType>(primitiveTypeNdx);
				const std::string		primitiveName = getTessPrimitiveTypeShaderName(primitiveType);
				const CaseDefinition	caseDef		  = { primitiveType, ioCases[caseNdx].ioType, vertexArraySizeCases[arrayCaseNdx].vertexIOArraySize,
														  std::string() + "vulkan/data/tessellation/user_defined_io_" + primitiveName + "_ref.png" };

				vertexArraySizeGroup->addChild(new UserDefinedIOTest(testCtx, primitiveName, "", caseDef));
			}
			ioTypeGroup->addChild(vertexArraySizeGroup.release());
		}
		group->addChild(ioTypeGroup.release());
	}

	return group.release();
}